

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::CommandLineInterface::PrintFreeFieldNumbers
          (CommandLineInterface *this,Descriptor *descriptor)

{
  btree_node<absl::lts_20250127::container_internal::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>
  bVar1;
  undefined4 uVar2;
  int iVar3;
  ReservedRange *pRVar4;
  CompressedTuple<absl::lts_20250127::container_internal::key_compare_adapter<std::less<std::pair<int,_int>_>,_std::pair<int,_int>_>::checked_compare,_std::allocator<std::pair<int,_int>_>,_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>_*>
  CVar5;
  CommandLineInterface *this_00;
  bool bVar6;
  Nonnull<const_char_*> pcVar7;
  reference ppVar8;
  ostream *poVar9;
  long lVar10;
  uint uVar11;
  long lVar12;
  ulong uVar13;
  const_iterator cVar14;
  Span<const_absl::lts_20250127::str_format_internal::FormatArgImpl> args;
  Span<const_absl::lts_20250127::str_format_internal::FormatArgImpl> args_00;
  Span<const_absl::lts_20250127::str_format_internal::FormatArgImpl> args_01;
  Span<const_absl::lts_20250127::str_format_internal::FormatArgImpl> args_02;
  UntypedFormatSpecImpl format;
  const_iterator other;
  UntypedFormatSpecImpl format_00;
  UntypedFormatSpecImpl format_01;
  UntypedFormatSpecImpl format_02;
  string output;
  vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
  nested_messages;
  btree_set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
  ranges;
  string local_c8;
  Data local_a8;
  code *local_a0;
  ulong local_98;
  code *local_90;
  Descriptor **local_88;
  iterator iStack_80;
  Descriptor **local_78;
  btree<absl::lts_20250127::container_internal::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>
  local_70;
  CommandLineInterface *local_58;
  btree_iterator<const_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>,_const_std::pair<int,_int>_&,_const_std::pair<int,_int>_*>
  local_50;
  ulong local_40;
  char *local_38;
  
  local_70.root_ =
       (node_type *)
       absl::lts_20250127::container_internal::
       btree<absl::lts_20250127::container_internal::set_params<std::pair<int,int>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>,256,false>>
       ::EmptyNode()::empty_node;
  local_70.rightmost_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::key_compare_adapter<std::less<std::pair<int,_int>_>,_std::pair<int,_int>_>::checked_compare,_std::allocator<std::pair<int,_int>_>,_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>_*>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>,_true>
  .
  super_Storage<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>_*,_2UL,_false>
  .value = (CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::key_compare_adapter<std::less<std::pair<int,_int>_>,_std::pair<int,_int>_>::checked_compare,_std::allocator<std::pair<int,_int>_>,_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>_*>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>,_true>
            )absl::lts_20250127::container_internal::
             btree<absl::lts_20250127::container_internal::set_params<std::pair<int,int>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>,256,false>>
             ::EmptyNode()::empty_node;
  local_70.size_ = 0;
  local_78 = (Descriptor **)0x0;
  local_88 = (Descriptor **)0x0;
  iStack_80._M_current = (Descriptor **)0x0;
  local_58 = this;
  if (0 < descriptor->field_count_) {
    lVar12 = 4;
    lVar10 = 0;
    do {
      local_c8._M_dataplus._M_p._0_4_ = *(int *)(&descriptor->fields_->super_SymbolBase + lVar12);
      local_c8._M_dataplus._M_p._4_4_ = (int)local_c8._M_dataplus._M_p + 1;
      absl::lts_20250127::container_internal::
      btree<absl::lts_20250127::container_internal::set_params<std::pair<int,int>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>,256,false>>
      ::insert_unique<std::pair<int,int>,std::pair<int,int>>
                ((pair<absl::lts_20250127::container_internal::btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>,_const_std::pair<int,_int>_&,_const_std::pair<int,_int>_*>,_bool>
                  *)&local_a8,
                 (btree<absl::lts_20250127::container_internal::set_params<std::pair<int,int>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>,256,false>>
                  *)&local_70,(pair<int,_int> *)&local_c8,(pair<int,_int> *)&local_c8);
      lVar10 = lVar10 + 1;
      lVar12 = lVar12 + 0x58;
    } while (lVar10 < descriptor->field_count_);
  }
  if (0 < descriptor->extension_range_count_) {
    lVar12 = 0;
    lVar10 = 0;
    do {
      uVar2 = *(undefined4 *)((long)&descriptor->extension_ranges_->start_ + lVar12);
      if (lVar10 < descriptor->extension_range_count_) {
        pcVar7 = (Nonnull<const_char_*>)0x0;
      }
      else {
        pcVar7 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                           (lVar10,(long)descriptor->extension_range_count_,
                            "index < extension_range_count()");
      }
      if (pcVar7 != (Nonnull<const_char_*>)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_a8,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                   ,0xa94,pcVar7);
        goto LAB_001d7d38;
      }
      local_c8._M_dataplus._M_p._4_4_ =
           *(undefined4 *)((long)&descriptor->extension_ranges_->end_ + lVar12);
      local_c8._M_dataplus._M_p._0_4_ = uVar2;
      absl::lts_20250127::container_internal::
      btree<absl::lts_20250127::container_internal::set_params<std::pair<int,int>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>,256,false>>
      ::insert_unique<std::pair<int,int>,std::pair<int,int>>
                ((pair<absl::lts_20250127::container_internal::btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>,_const_std::pair<int,_int>_&,_const_std::pair<int,_int>_*>,_bool>
                  *)&local_a8,
                 (btree<absl::lts_20250127::container_internal::set_params<std::pair<int,int>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>,256,false>>
                  *)&local_70,(pair<int,_int> *)&local_c8,(pair<int,_int> *)&local_c8);
      lVar10 = lVar10 + 1;
      lVar12 = lVar12 + 0x28;
    } while (lVar10 < descriptor->extension_range_count_);
  }
  if (0 < descriptor->reserved_range_count_) {
    lVar10 = 0;
    do {
      pRVar4 = descriptor->reserved_ranges_;
      if (lVar10 < descriptor->reserved_range_count_) {
        pcVar7 = (Nonnull<const_char_*>)0x0;
      }
      else {
        pcVar7 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                           (lVar10,(long)descriptor->reserved_range_count_,
                            "index < reserved_range_count()");
      }
      if (pcVar7 != (Nonnull<const_char_*>)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_a8,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                   ,0xa99,pcVar7);
LAB_001d7d38:
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_a8);
      }
      local_c8._M_dataplus._M_p._4_4_ = descriptor->reserved_ranges_[lVar10].end;
      local_c8._M_dataplus._M_p._0_4_ = pRVar4[lVar10].start;
      absl::lts_20250127::container_internal::
      btree<absl::lts_20250127::container_internal::set_params<std::pair<int,int>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>,256,false>>
      ::insert_unique<std::pair<int,int>,std::pair<int,int>>
                ((pair<absl::lts_20250127::container_internal::btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>,_const_std::pair<int,_int>_&,_const_std::pair<int,_int>_*>,_bool>
                  *)&local_a8,
                 (btree<absl::lts_20250127::container_internal::set_params<std::pair<int,int>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>,256,false>>
                  *)&local_70,(pair<int,_int> *)&local_c8,(pair<int,_int> *)&local_c8);
      lVar10 = lVar10 + 1;
    } while (lVar10 < descriptor->reserved_range_count_);
  }
  if (0 < descriptor->nested_type_count_) {
    lVar12 = 0;
    lVar10 = 0;
    do {
      local_a8.ptr = &descriptor->nested_types_->super_SymbolBase + lVar12;
      if (iStack_80._M_current == local_78) {
        std::
        vector<google::protobuf::Descriptor_const*,std::allocator<google::protobuf::Descriptor_const*>>
        ::_M_realloc_insert<google::protobuf::Descriptor_const*const&>
                  ((vector<google::protobuf::Descriptor_const*,std::allocator<google::protobuf::Descriptor_const*>>
                    *)&local_88,iStack_80,(Descriptor **)&local_a8.ptr);
      }
      else {
        *iStack_80._M_current = (Descriptor *)local_a8;
        iStack_80._M_current = iStack_80._M_current + 1;
      }
      lVar10 = lVar10 + 1;
      lVar12 = lVar12 + 0xa0;
    } while (lVar10 < descriptor->nested_type_count_);
  }
  this_00 = local_58;
  if (iStack_80._M_current != local_88) {
    uVar13 = 0;
    do {
      PrintFreeFieldNumbers(this_00,local_88[uVar13]);
      uVar13 = uVar13 + 1;
    } while (uVar13 < (ulong)((long)iStack_80._M_current - (long)local_88 >> 3));
  }
  local_38 = (descriptor->all_names_).payload_;
  local_40 = (ulong)*(ushort *)(local_38 + 2);
  local_a8.ptr = &local_40;
  local_38 = local_38 + ~local_40;
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  local_c8._M_string_length = 0;
  local_c8.field_2._M_local_buf[0] = '\0';
  local_a0 = absl::lts_20250127::str_format_internal::FormatArgImpl::
             Dispatch<std::basic_string_view<char,std::char_traits<char>>>;
  args.len_ = 1;
  args.ptr_ = (pointer)&local_a8;
  format.size_ = 0xb;
  format.data_ = "%-35s free:";
  absl::lts_20250127::str_format_internal::AppendPack(&local_c8,format,args);
  cVar14 = absl::lts_20250127::container_internal::
           btree<absl::lts_20250127::container_internal::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>
           ::begin(&local_70);
  CVar5.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::key_compare_adapter<std::less<std::pair<int,_int>_>,_std::pair<int,_int>_>::checked_compare,_std::allocator<std::pair<int,_int>_>,_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>_*>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>,_true>
  .
  super_Storage<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>_*,_2UL,_false>
  .value = local_70.rightmost_.
           super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::key_compare_adapter<std::less<std::pair<int,_int>_>,_std::pair<int,_int>_>::checked_compare,_std::allocator<std::pair<int,_int>_>,_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>_*>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>,_true>
           .
           super_Storage<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>_*,_2UL,_false>
           .value;
  local_50.node_ = cVar14.node_;
  local_50.position_ = cVar14.position_;
  if (((ulong)local_70.rightmost_.
              super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::key_compare_adapter<std::less<std::pair<int,_int>_>,_std::pair<int,_int>_>::checked_compare,_std::allocator<std::pair<int,_int>_>,_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>_*>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>,_true>
              .
              super_Storage<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>_*,_2UL,_false>
              .value & 7) != 0) {
    __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/layout.h"
                  ,0x1fe,
                  "CopyConst<Char, ElementType<N>> *absl::container_internal::internal_layout::LayoutImpl<std::tuple<absl::container_internal::btree_node<absl::container_internal::set_params<std::pair<int, int>, std::less<std::pair<int, int>>, std::allocator<std::pair<int, int>>, 256, false>> *, unsigned int, unsigned char, std::pair<int, int>, absl::container_internal::btree_node<absl::container_internal::set_params<std::pair<int, int>, std::less<std::pair<int, int>>, std::allocator<std::pair<int, int>>, 256, false>> *>, std::integer_sequence<unsigned long, 1, 0, 4, 30, 31>, std::integer_sequence<unsigned long>, std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>, std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>>::Pointer(Char *) const [Elements = std::tuple<absl::container_internal::btree_node<absl::container_internal::set_params<std::pair<int, int>, std::less<std::pair<int, int>>, std::allocator<std::pair<int, int>>, 256, false>> *, unsigned int, unsigned char, std::pair<int, int>, absl::container_internal::btree_node<absl::container_internal::set_params<std::pair<int, int>, std::less<std::pair<int, int>>, std::allocator<std::pair<int, int>>, 256, false>> *>, StaticSizeSeq = std::integer_sequence<unsigned long, 1, 0, 4, 30, 31>, RuntimeSizeSeq = std::integer_sequence<unsigned long>, SizeSeq = std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>, OffsetSeq = std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>, N = 2UL, Char = const char]"
                 );
  }
  bVar1 = *(btree_node<absl::lts_20250127::container_internal::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>
            *)((long)local_70.rightmost_.
                     super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::key_compare_adapter<std::less<std::pair<int,_int>_>,_std::pair<int,_int>_>::checked_compare,_std::allocator<std::pair<int,_int>_>,_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>_*>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>,_true>
                     .
                     super_Storage<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>_*,_2UL,_false>
                     .value + 10);
  uVar11 = 1;
  while (other.position_._0_1_ = bVar1,
        other.node_ = (btree_node<absl::lts_20250127::container_internal::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>
                       *)CVar5.
                         super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::key_compare_adapter<std::less<std::pair<int,_int>_>,_std::pair<int,_int>_>::checked_compare,_std::allocator<std::pair<int,_int>_>,_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>_*>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>,_true>
                         .
                         super_Storage<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>_*,_2UL,_false>
                         .value, other._9_7_ = 0,
        bVar6 = absl::lts_20250127::container_internal::
                btree_iterator<const_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>,_const_std::pair<int,_int>_&,_const_std::pair<int,_int>_*>
                ::Equals(&local_50,other), !bVar6) {
    ppVar8 = absl::lts_20250127::container_internal::
             btree_iterator<const_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>,_const_std::pair<int,_int>_&,_const_std::pair<int,_int>_*>
             ::operator*(&local_50);
    if ((int)uVar11 < ppVar8->second) {
      iVar3 = ppVar8->first;
      if ((int)uVar11 < iVar3) {
        local_a8._4_4_ = 0;
        local_a8._0_4_ = uVar11;
        if (uVar11 + 1 == iVar3) {
          local_a0 = absl::lts_20250127::str_format_internal::FormatArgImpl::Dispatch<int>;
          args_00.len_ = 1;
          args_00.ptr_ = (pointer)&local_a8;
          format_00.size_ = 3;
          format_00.data_ = " %d";
          absl::lts_20250127::str_format_internal::AppendPack(&local_c8,format_00,args_00);
        }
        else {
          local_98 = (ulong)(iVar3 - 1);
          local_a0 = absl::lts_20250127::str_format_internal::FormatArgImpl::Dispatch<int>;
          local_90 = absl::lts_20250127::str_format_internal::FormatArgImpl::Dispatch<int>;
          args_01.len_ = 2;
          args_01.ptr_ = (pointer)&local_a8;
          format_01.size_ = 6;
          format_01.data_ = " %d-%d";
          absl::lts_20250127::str_format_internal::AppendPack(&local_c8,format_01,args_01);
        }
      }
      uVar11 = ppVar8->second;
    }
    absl::lts_20250127::container_internal::
    btree_iterator<const_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>,_const_std::pair<int,_int>_&,_const_std::pair<int,_int>_*>
    ::increment(&local_50);
  }
  if ((int)uVar11 < 0x20000000) {
    local_a8._4_4_ = 0;
    local_a8._0_4_ = uVar11;
    local_a0 = absl::lts_20250127::str_format_internal::FormatArgImpl::Dispatch<int>;
    args_02.len_ = 1;
    args_02.ptr_ = (pointer)&local_a8;
    format_02.size_ = 7;
    format_02.data_ = " %d-INF";
    absl::lts_20250127::str_format_internal::AppendPack(&local_c8,format_02,args_02);
  }
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_c8._M_dataplus._M_p,local_c8._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
  std::ostream::put((char)poVar9);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,
                    CONCAT71(local_c8.field_2._M_allocated_capacity._1_7_,
                             local_c8.field_2._M_local_buf[0]) + 1);
  }
  if (local_88 != (Descriptor **)0x0) {
    operator_delete(local_88,(long)local_78 - (long)local_88);
  }
  absl::lts_20250127::container_internal::
  btree<absl::lts_20250127::container_internal::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>
  ::~btree(&local_70);
  return;
}

Assistant:

void CommandLineInterface::PrintFreeFieldNumbers(const Descriptor* descriptor) {
  absl::btree_set<FieldRange> ranges;
  std::vector<const Descriptor*> nested_messages;
  GatherOccupiedFieldRanges(descriptor, &ranges, &nested_messages);

  for (size_t i = 0; i < nested_messages.size(); ++i) {
    PrintFreeFieldNumbers(nested_messages[i]);
  }
  FormatFreeFieldNumbers(descriptor->full_name(), ranges);
}